

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O1

bool __thiscall RealDiskInterface::WriteFile(RealDiskInterface *this,string *path,string *contents)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  pointer pcVar5;
  char *msg;
  
  __s = fopen((path->_M_dataplus)._M_p,"w");
  if (__s == (FILE *)0x0) {
    pcVar5 = (path->_M_dataplus)._M_p;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    msg = "WriteFile(%s): Unable to create file. %s";
  }
  else {
    sVar2 = fwrite((contents->_M_dataplus)._M_p,1,contents->_M_string_length,__s);
    if (sVar2 < contents->_M_string_length) {
      pcVar5 = (path->_M_dataplus)._M_p;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      Error("WriteFile(%s): Unable to write to the file. %s",pcVar5,pcVar4);
      fclose(__s);
      return false;
    }
    iVar1 = fclose(__s);
    if (iVar1 != -1) {
      return true;
    }
    pcVar5 = (path->_M_dataplus)._M_p;
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    msg = "WriteFile(%s): Unable to close the file. %s";
  }
  Error(msg,pcVar5,pcVar4);
  return false;
}

Assistant:

bool RealDiskInterface::WriteFile(const string& path, const string& contents) {
  FILE* fp = fopen(path.c_str(), "w");
  if (fp == NULL) {
    Error("WriteFile(%s): Unable to create file. %s",
          path.c_str(), strerror(errno));
    return false;
  }

  if (fwrite(contents.data(), 1, contents.length(), fp) < contents.length())  {
    Error("WriteFile(%s): Unable to write to the file. %s",
          path.c_str(), strerror(errno));
    fclose(fp);
    return false;
  }

  if (fclose(fp) == EOF) {
    Error("WriteFile(%s): Unable to close the file. %s",
          path.c_str(), strerror(errno));
    return false;
  }

  return true;
}